

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gkc.c
# Opt level: O1

gkc_summary * gkc_combine(gkc_summary *s1,gkc_summary *s2)

{
  list *plVar1;
  list *plVar2;
  list *plVar3;
  gkc_summary *s;
  gkc_tuple *pgVar4;
  ulong uVar5;
  list *plVar6;
  list *plVar7;
  list *plVar8;
  list *plVar9;
  double dVar10;
  
  dVar10 = s1->epsilon;
  if ((dVar10 != s2->epsilon) || (NAN(dVar10) || NAN(s2->epsilon))) {
    s = (gkc_summary *)0x0;
  }
  else {
    s = (gkc_summary *)calloc(1,0x38);
    (s->head).next = &s->head;
    (s->head).prev = &s->head;
    s->epsilon = dVar10;
    plVar7 = (s1->head).next;
    plVar9 = &s1->head;
    plVar6 = (s2->head).next;
    plVar8 = &s2->head;
    if (plVar6 != plVar8 && plVar7 != plVar9) {
      do {
        pgVar4 = gkc_alloc(s);
        if (plVar7[-2].next < plVar6[-2].next) {
          pgVar4->value = (uint64_t)plVar7[-2].next;
          pgVar4->g = (double)plVar7[-1].prev;
          pgVar4->delta = (uint64_t)plVar7[-1].next;
          plVar7 = plVar7->next;
        }
        else {
          pgVar4->value = (uint64_t)plVar6[-2].next;
          pgVar4->g = (double)plVar6[-1].prev;
          pgVar4->delta = (uint64_t)plVar6[-1].next;
          plVar6 = plVar6->next;
        }
        plVar1 = (s->head).prev;
        plVar2 = plVar1->next;
        (pgVar4->node).next = plVar2;
        plVar2->prev = &pgVar4->node;
        plVar1->next = &pgVar4->node;
        (pgVar4->node).prev = plVar1;
        dVar10 = ((double)CONCAT44(0x45300000,(int)(s->nr_elems >> 0x20)) - 1.9342813113834067e+25)
                 + ((double)CONCAT44(0x43300000,(int)s->nr_elems) - 4503599627370496.0) + pgVar4->g;
        uVar5 = (ulong)dVar10;
        s->nr_elems = (long)(dVar10 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
      } while ((plVar7 != plVar9) && (plVar6 != plVar8));
    }
    for (; plVar7 != plVar9; plVar7 = plVar7->next) {
      pgVar4 = gkc_alloc(s);
      pgVar4->value = (uint64_t)plVar7[-2].next;
      plVar1 = plVar7[-1].prev;
      pgVar4->g = (double)plVar1;
      pgVar4->delta = (uint64_t)plVar7[-1].next;
      plVar2 = (s->head).prev;
      plVar3 = plVar2->next;
      (pgVar4->node).next = plVar3;
      plVar3->prev = &pgVar4->node;
      plVar2->next = &pgVar4->node;
      (pgVar4->node).prev = plVar2;
      dVar10 = ((double)CONCAT44(0x45300000,(int)(s->nr_elems >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)s->nr_elems) - 4503599627370496.0) + (double)plVar1
      ;
      uVar5 = (ulong)dVar10;
      s->nr_elems = (long)(dVar10 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
    }
    for (; plVar6 != plVar8; plVar6 = plVar6->next) {
      pgVar4 = gkc_alloc(s);
      pgVar4->value = (uint64_t)plVar6[-2].next;
      plVar7 = plVar6[-1].prev;
      pgVar4->g = (double)plVar7;
      pgVar4->delta = (uint64_t)plVar6[-1].next;
      plVar9 = (s->head).prev;
      plVar1 = plVar9->next;
      (pgVar4->node).next = plVar1;
      plVar1->prev = &pgVar4->node;
      plVar9->next = &pgVar4->node;
      (pgVar4->node).prev = plVar9;
      dVar10 = ((double)CONCAT44(0x45300000,(int)(s->nr_elems >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)s->nr_elems) - 4503599627370496.0) + (double)plVar7
      ;
      uVar5 = (ulong)dVar10;
      s->nr_elems = (long)(dVar10 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
    }
    s->max_alloced = s->alloced;
    gkc_compress(s);
  }
  return s;
}

Assistant:

struct gkc_summary *gkc_combine(struct gkc_summary *s1, struct gkc_summary *s2)
{
    struct gkc_summary *snew;
    struct list *cur1, *cur2;
    struct gkc_tuple *tcur1, *tcur2, *tnew;

    if (s1->epsilon != s2->epsilon) {
        return NULL;
    }
    snew = gkc_summary_alloc(s1->epsilon);

    cur1 = s1->head.next;
    cur2 = s2->head.next;
    while (cur1 != &s1->head && cur2 != &s2->head) {
        tcur1 = list_to_tuple(cur1);
        tcur2 = list_to_tuple(cur2);

        tnew = gkc_alloc(snew);
        if (tcur1->value < tcur2->value) {
            tnew->value = tcur1->value;
            tnew->g = tcur1->g;
            tnew->delta = tcur1->delta;
            cur1 = cur1->next;
        } else {
            tnew->value = tcur2->value;
            tnew->g = tcur2->g;
            tnew->delta = tcur2->delta;
            cur2 = cur2->next;
        }
        list_add_tail(&snew->head, &tnew->node);
        snew->nr_elems += tnew->g;
    }
    while (cur1 != &s1->head) {
        tcur1 = list_to_tuple(cur1);

        tnew = gkc_alloc(snew);
        tnew->value = tcur1->value;
        tnew->g = tcur1->g;
        tnew->delta = tcur1->delta;
        list_add_tail(&snew->head, &tnew->node);
        snew->nr_elems += tnew->g;
        cur1 = cur1->next;
    }
    while (cur2 != &s2->head) {
        tcur2 = list_to_tuple(cur2);

        tnew = gkc_alloc(snew);
        tnew->value = tcur2->value;
        tnew->g = tcur2->g;
        tnew->delta = tcur2->delta;
        list_add_tail(&snew->head, &tnew->node);
        snew->nr_elems += tnew->g;
        cur2 = cur2->next;
    }
    snew->max_alloced = snew->alloced;
    gkc_compress(snew);

    return snew;
}